

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O0

void __thiscall Assimp::ValidateDSProcess::Validate(ValidateDSProcess *this,aiAnimation *pAnimation)

{
  uint local_1c;
  uint i;
  aiAnimation *pAnimation_local;
  ValidateDSProcess *this_local;
  
  Validate(this,&pAnimation->mName);
  if (pAnimation->mNumChannels == 0) {
    ReportError(this,
                "aiAnimation::mNumChannels is 0. At least one node animation channel must be there."
               );
  }
  if (pAnimation->mChannels == (aiNodeAnim **)0x0) {
    ReportError(this,"aiAnimation::mChannels is NULL (aiAnimation::mNumChannels is %i)",
                (ulong)pAnimation->mNumChannels);
  }
  local_1c = 0;
  while( true ) {
    if (pAnimation->mNumChannels <= local_1c) {
      return;
    }
    if (pAnimation->mChannels[local_1c] == (aiNodeAnim *)0x0) break;
    Validate(this,pAnimation,pAnimation->mChannels[local_1c]);
    local_1c = local_1c + 1;
  }
  ReportError(this,"aiAnimation::mChannels[%i] is NULL (aiAnimation::mNumChannels is %i)",
              (ulong)local_1c,(ulong)pAnimation->mNumChannels);
}

Assistant:

void ValidateDSProcess::Validate( const aiAnimation* pAnimation)
{
    Validate(&pAnimation->mName);

    // validate all materials
    if (pAnimation->mNumChannels)
    {
        if (!pAnimation->mChannels) {
            ReportError("aiAnimation::mChannels is NULL (aiAnimation::mNumChannels is %i)",
                pAnimation->mNumChannels);
        }
        for (unsigned int i = 0; i < pAnimation->mNumChannels;++i)
        {
            if (!pAnimation->mChannels[i])
            {
                ReportError("aiAnimation::mChannels[%i] is NULL (aiAnimation::mNumChannels is %i)",
                    i, pAnimation->mNumChannels);
            }
            Validate(pAnimation, pAnimation->mChannels[i]);
        }
    }
    else {
    	ReportError("aiAnimation::mNumChannels is 0. At least one node animation channel must be there.");
    }
}